

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int htrans64(LONGLONG *a,int nx,int ny)

{
  sbyte sVar1;
  long lVar2;
  LONGLONG *tmp_00;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  int local_a4;
  LONGLONG *tmp;
  LONGLONG mask2;
  LONGLONG mask;
  LONGLONG nrnd2;
  LONGLONG prnd2;
  LONGLONG prnd;
  LONGLONG hc;
  LONGLONG hy;
  LONGLONG hx;
  LONGLONG h0;
  int s00;
  int s10;
  int shift;
  int oddy;
  int oddx;
  int k;
  int j;
  int i;
  int nytop;
  int nxtop;
  int log2n;
  int nmax;
  int ny_local;
  int nx_local;
  LONGLONG *a_local;
  
  local_a4 = ny;
  if (ny < nx) {
    local_a4 = nx;
  }
  dVar5 = log((double)local_a4);
  dVar6 = log(2.0);
  nytop = (int)(dVar5 / dVar6 + 0.5);
  if (1 << ((byte)nytop & 0x1f) < local_a4) {
    nytop = nytop + 1;
  }
  tmp_00 = (LONGLONG *)malloc((long)((local_a4 + 1) / 2) << 3);
  if (tmp_00 == (LONGLONG *)0x0) {
    ffpmsg("htrans64: insufficient memory");
    a_local._4_4_ = 0x19d;
  }
  else {
    s00 = 0;
    mask2 = -2;
    tmp = (LONGLONG *)0xfffffffffffffffc;
    prnd2 = 1;
    nrnd2 = 2;
    mask = 1;
    j = ny;
    i = nx;
    for (oddy = 0; oddy < nytop; oddy = oddy + 1) {
      iVar4 = j % 2;
      for (k = 0; sVar1 = (sbyte)s00, k < i - i % 2; k = k + 2) {
        h0._0_4_ = k * ny;
        h0._4_4_ = (int)h0 + ny;
        for (oddx = 0; oddx < j - iVar4; oddx = oddx + 2) {
          lVar3 = a[h0._4_4_ + 1] + a[h0._4_4_] + a[(int)h0 + 1] + a[(int)h0] >> sVar1;
          local_b8 = ((a[h0._4_4_ + 1] + a[h0._4_4_]) - a[(int)h0 + 1]) - a[(int)h0] >> sVar1;
          local_c0 = ((a[h0._4_4_ + 1] - a[h0._4_4_]) + a[(int)h0 + 1]) - a[(int)h0] >> sVar1;
          a[h0._4_4_ + 1] = ((a[h0._4_4_ + 1] - a[h0._4_4_]) - a[(int)h0 + 1]) + a[(int)h0] >> sVar1
          ;
          if (-1 < (long)local_b8) {
            local_b8 = local_b8 + prnd2;
          }
          a[h0._4_4_] = local_b8 & mask2;
          if (-1 < (long)local_c0) {
            local_c0 = local_c0 + prnd2;
          }
          a[(int)h0 + 1] = local_c0 & mask2;
          lVar2 = mask;
          if (-1 < lVar3) {
            lVar2 = nrnd2;
          }
          local_c8 = lVar3 + lVar2;
          a[(int)h0] = local_c8 & (ulong)tmp;
          h0._0_4_ = (int)h0 + 2;
          h0._4_4_ = h0._4_4_ + 2;
        }
        if (iVar4 != 0) {
          lVar3 = a[h0._4_4_] + a[(int)h0] << (1U - sVar1 & 0x3f);
          local_d0 = a[h0._4_4_] - a[(int)h0] << (1U - sVar1 & 0x3f);
          if (-1 < (long)local_d0) {
            local_d0 = local_d0 + prnd2;
          }
          a[h0._4_4_] = local_d0 & mask2;
          lVar2 = mask;
          if (-1 < lVar3) {
            lVar2 = nrnd2;
          }
          local_d8 = lVar3 + lVar2;
          a[(int)h0] = local_d8 & (ulong)tmp;
        }
      }
      if (i % 2 != 0) {
        h0._0_4_ = k * ny;
        for (oddx = 0; oddx < j - iVar4; oddx = oddx + 2) {
          lVar3 = a[(int)h0 + 1] + a[(int)h0] << (1U - sVar1 & 0x3f);
          local_e0 = a[(int)h0 + 1] - a[(int)h0] << (1U - sVar1 & 0x3f);
          if (-1 < (long)local_e0) {
            local_e0 = local_e0 + prnd2;
          }
          a[(int)h0 + 1] = local_e0 & mask2;
          lVar2 = mask;
          if (-1 < lVar3) {
            lVar2 = nrnd2;
          }
          local_e8 = lVar3 + lVar2;
          a[(int)h0] = local_e8 & (ulong)tmp;
          h0._0_4_ = (int)h0 + 2;
        }
        if (iVar4 != 0) {
          lVar3 = a[(int)h0] << (2U - sVar1 & 0x3f);
          if (-1 < lVar3) {
            mask = nrnd2;
          }
          local_f0 = lVar3 + mask;
          a[(int)h0] = local_f0 & (ulong)tmp;
        }
      }
      for (k = 0; k < i; k = k + 1) {
        shuffle64(a + ny * k,j,1,tmp_00);
      }
      for (oddx = 0; oddx < j; oddx = oddx + 1) {
        shuffle64(a + oddx,i,ny,tmp_00);
      }
      i = i + 1 >> 1;
      j = j + 1 >> 1;
      s00 = 1;
      mask2 = (LONGLONG)tmp;
      prnd2 = nrnd2;
      tmp = (LONGLONG *)((long)tmp << 1);
      nrnd2 = nrnd2 * 2;
      mask = nrnd2 + -1;
    }
    free(tmp_00);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int htrans64(LONGLONG a[],int nx,int ny)
{
int nmax, log2n, nxtop, nytop, i, j, k;
int oddx, oddy;
int shift;
int s10, s00;
LONGLONG h0, hx, hy, hc, prnd, prnd2, nrnd2, mask, mask2;
LONGLONG *tmp;

	/*
	 * log2n is log2 of max(nx,ny) rounded up to next power of 2
	 */
	nmax = (nx>ny) ? nx : ny;
	log2n = (int) (log((float) nmax)/log(2.0)+0.5);
	if ( nmax > (1<<log2n) ) {
		log2n += 1;
	}
	/*
	 * get temporary storage for shuffling elements
	 */
	tmp = (LONGLONG *) malloc(((nmax+1)/2)*sizeof(LONGLONG));
	if(tmp == (LONGLONG *) NULL) {
	        ffpmsg("htrans64: insufficient memory");
		return(DATA_COMPRESSION_ERR);
	}
	/*
	 * set up rounding and shifting masks
	 */
	shift = 0;
	mask  = (LONGLONG) -2;
	mask2 = mask << 1;
	prnd  = (LONGLONG) 1;
	prnd2 = prnd << 1;
	nrnd2 = prnd2 - 1;
	/*
	 * do log2n reductions
	 *
	 * We're indexing a as a 2-D array with dimensions (nx,ny).
	 */
	nxtop = nx;
	nytop = ny;

	for (k = 0; k<log2n; k++) {
		oddx = nxtop % 2;
		oddy = nytop % 2;
		for (i = 0; i<nxtop-oddx; i += 2) {
			s00 = i*ny;				/* s00 is index of a[i,j]	*/
			s10 = s00+ny;			/* s10 is index of a[i+1,j]	*/
			for (j = 0; j<nytop-oddy; j += 2) {
				/*
				 * Divide h0,hx,hy,hc by 2 (1 the first time through).
				 */
				h0 = (a[s10+1] + a[s10] + a[s00+1] + a[s00]) >> shift;
				hx = (a[s10+1] + a[s10] - a[s00+1] - a[s00]) >> shift;
				hy = (a[s10+1] - a[s10] + a[s00+1] - a[s00]) >> shift;
				hc = (a[s10+1] - a[s10] - a[s00+1] + a[s00]) >> shift;

				/*
				 * Throw away the 2 bottom bits of h0, bottom bit of hx,hy.
				 * To get rounding to be same for positive and negative
				 * numbers, nrnd2 = prnd2 - 1.
				 */
				a[s10+1] = hc;
				a[s10  ] = ( (hx>=0) ? (hx+prnd)  :  hx        ) & mask ;
				a[s00+1] = ( (hy>=0) ? (hy+prnd)  :  hy        ) & mask ;
				a[s00  ] = ( (h0>=0) ? (h0+prnd2) : (h0+nrnd2) ) & mask2;
				s00 += 2;
				s10 += 2;
			}
			if (oddy) {
				/*
				 * do last element in row if row length is odd
				 * s00+1, s10+1 are off edge
				 */
				h0 = (a[s10] + a[s00]) << (1-shift);
				hx = (a[s10] - a[s00]) << (1-shift);
				a[s10  ] = ( (hx>=0) ? (hx+prnd)  :  hx        ) & mask ;
				a[s00  ] = ( (h0>=0) ? (h0+prnd2) : (h0+nrnd2) ) & mask2;
				s00 += 1;
				s10 += 1;
			}
		}
		if (oddx) {
			/*
			 * do last row if column length is odd
			 * s10, s10+1 are off edge
			 */
			s00 = i*ny;
			for (j = 0; j<nytop-oddy; j += 2) {
				h0 = (a[s00+1] + a[s00]) << (1-shift);
				hy = (a[s00+1] - a[s00]) << (1-shift);
				a[s00+1] = ( (hy>=0) ? (hy+prnd)  :  hy        ) & mask ;
				a[s00  ] = ( (h0>=0) ? (h0+prnd2) : (h0+nrnd2) ) & mask2;
				s00 += 2;
			}
			if (oddy) {
				/*
				 * do corner element if both row and column lengths are odd
				 * s00+1, s10, s10+1 are off edge
				 */
				h0 = a[s00] << (2-shift);
				a[s00  ] = ( (h0>=0) ? (h0+prnd2) : (h0+nrnd2) ) & mask2;
			}
		}
		/*
		 * now shuffle in each dimension to group coefficients by order
		 */
		for (i = 0; i<nxtop; i++) {
			shuffle64(&a[ny*i],nytop,1,tmp);
		}
		for (j = 0; j<nytop; j++) {
			shuffle64(&a[j],nxtop,ny,tmp);
		}
		/*
		 * image size reduced by 2 (round up if odd)
		 */
		nxtop = (nxtop+1)>>1;
		nytop = (nytop+1)>>1;
		/*
		 * divisor doubles after first reduction
		 */
		shift = 1;
		/*
		 * masks, rounding values double after each iteration
		 */
		mask  = mask2;
		prnd  = prnd2;
		mask2 = mask2 << 1;
		prnd2 = prnd2 << 1;
		nrnd2 = prnd2 - 1;
	}
	free(tmp);
	return(0);
}